

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftplistparser.c
# Opt level: O0

int ftp_pl_get_permission(char *str)

{
  uint local_14;
  int permissions;
  char *str_local;
  
  local_14 = 0;
  if (*str == 'r') {
    local_14 = 0x100;
  }
  else if (*str != '-') {
    local_14 = 0x1000000;
  }
  if (str[1] == 'w') {
    local_14 = local_14 | 0x80;
  }
  else if (str[1] != '-') {
    local_14 = local_14 | 0x1000000;
  }
  if (str[2] == 'x') {
    local_14 = local_14 | 0x40;
  }
  else if (str[2] == 's') {
    local_14 = local_14 | 0x840;
  }
  else if (str[2] == 'S') {
    local_14 = local_14 | 0x800;
  }
  else if (str[2] != '-') {
    local_14 = local_14 | 0x1000000;
  }
  if (str[3] == 'r') {
    local_14 = local_14 | 0x20;
  }
  else if (str[3] != '-') {
    local_14 = local_14 | 0x1000000;
  }
  if (str[4] == 'w') {
    local_14 = local_14 | 0x10;
  }
  else if (str[4] != '-') {
    local_14 = local_14 | 0x1000000;
  }
  if (str[5] == 'x') {
    local_14 = local_14 | 8;
  }
  else if (str[5] == 's') {
    local_14 = local_14 | 0x408;
  }
  else if (str[5] == 'S') {
    local_14 = local_14 | 0x400;
  }
  else if (str[5] != '-') {
    local_14 = local_14 | 0x1000000;
  }
  if (str[6] == 'r') {
    local_14 = local_14 | 4;
  }
  else if (str[6] != '-') {
    local_14 = local_14 | 0x1000000;
  }
  if (str[7] == 'w') {
    local_14 = local_14 | 2;
  }
  else if (str[7] != '-') {
    local_14 = local_14 | 0x1000000;
  }
  if (str[8] == 'x') {
    local_14 = local_14 | 1;
  }
  else if (str[8] == 't') {
    local_14 = local_14 | 0x201;
  }
  else if (str[8] == 'T') {
    local_14 = local_14 | 0x200;
  }
  else if (str[8] != '-') {
    local_14 = local_14 | 0x1000000;
  }
  return local_14;
}

Assistant:

static int ftp_pl_get_permission(const char *str)
{
  int permissions = 0;
  /* USER */
  if(str[0] == 'r')
    permissions |= 1 << 8;
  else if(str[0] != '-')
    permissions |= FTP_LP_MALFORMATED_PERM;
  if(str[1] == 'w')
    permissions |= 1 << 7;
  else if(str[1] != '-')
    permissions |= FTP_LP_MALFORMATED_PERM;

  if(str[2] == 'x')
    permissions |= 1 << 6;
  else if(str[2] == 's') {
    permissions |= 1 << 6;
    permissions |= 1 << 11;
  }
  else if(str[2] == 'S')
    permissions |= 1 << 11;
  else if(str[2] != '-')
    permissions |= FTP_LP_MALFORMATED_PERM;
  /* GROUP */
  if(str[3] == 'r')
    permissions |= 1 << 5;
  else if(str[3] != '-')
    permissions |= FTP_LP_MALFORMATED_PERM;
  if(str[4] == 'w')
    permissions |= 1 << 4;
  else if(str[4] != '-')
    permissions |= FTP_LP_MALFORMATED_PERM;
  if(str[5] == 'x')
    permissions |= 1 << 3;
  else if(str[5] == 's') {
    permissions |= 1 << 3;
    permissions |= 1 << 10;
  }
  else if(str[5] == 'S')
    permissions |= 1 << 10;
  else if(str[5] != '-')
    permissions |= FTP_LP_MALFORMATED_PERM;
  /* others */
  if(str[6] == 'r')
    permissions |= 1 << 2;
  else if(str[6] != '-')
    permissions |= FTP_LP_MALFORMATED_PERM;
  if(str[7] == 'w')
    permissions |= 1 << 1;
  else if(str[7] != '-')
      permissions |= FTP_LP_MALFORMATED_PERM;
  if(str[8] == 'x')
    permissions |= 1;
  else if(str[8] == 't') {
    permissions |= 1;
    permissions |= 1 << 9;
  }
  else if(str[8] == 'T')
    permissions |= 1 << 9;
  else if(str[8] != '-')
    permissions |= FTP_LP_MALFORMATED_PERM;

  return permissions;
}